

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ReporterRegistry::registerReporter
          (ReporterRegistry *this,string *name,IReporterFactory *factory)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>
  local_48;
  IReporterFactory *local_20;
  IReporterFactory *factory_local;
  string *name_local;
  ReporterRegistry *this_local;
  
  local_20 = factory;
  factory_local = (IReporterFactory *)name;
  name_local = (string *)this;
  std::make_pair<std::__cxx11::string_const&,Catch::IReporterFactory*&>(&local_48,name,&local_20);
  std::
  map<std::__cxx11::string,Catch::IReporterFactory*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::IReporterFactory*>>>
  ::insert<std::pair<std::__cxx11::string,Catch::IReporterFactory*>>
            ((map<std::__cxx11::string,Catch::IReporterFactory*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::IReporterFactory*>>>
              *)&this->m_factories,&local_48);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>
  ::~pair(&local_48);
  return;
}

Assistant:

void registerReporter( const std::string& name, IReporterFactory* factory ) {
            m_factories.insert( std::make_pair( name, factory ) );
        }